

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O1

int __thiscall
VVCStreamReader::toFullPicOrder(VVCStreamReader *this,VvcSliceHeader *slice,int pic_bits)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  
  bVar3 = VvcSliceHeader::isIDR(slice);
  if (bVar3) {
    this->m_picOrderBase = this->m_frameNum;
    this->m_picOrderMsb = 0;
    this->m_prevPicOrder = 0;
  }
  else {
    iVar4 = 1 << ((byte)pic_bits & 0x1f);
    uVar1 = slice->pic_order_cnt_lsb;
    iVar2 = this->m_prevPicOrder;
    uVar5 = (uint)uVar1;
    if (((int)(uint)uVar1 < iVar2) && (iVar4 / 2 <= (int)(iVar2 - (uint)uVar1))) {
      this->m_picOrderMsb = this->m_picOrderMsb + iVar4;
    }
    else if ((iVar2 < (int)uVar5) && (iVar4 / 2 <= (int)(uVar5 - iVar2))) {
      this->m_picOrderMsb = this->m_picOrderMsb - iVar4;
    }
    this->m_prevPicOrder = uVar5;
  }
  return (uint)slice->pic_order_cnt_lsb + this->m_picOrderMsb + this->m_picOrderBase;
}

Assistant:

int VVCStreamReader::toFullPicOrder(const VvcSliceHeader* slice, const int pic_bits)
{
    if (slice->isIDR())
    {
        m_picOrderBase = m_frameNum;
        m_picOrderMsb = 0;
        m_prevPicOrder = 0;
    }
    else
    {
        const int range = 1 << pic_bits;

        if (slice->pic_order_cnt_lsb < m_prevPicOrder && m_prevPicOrder - slice->pic_order_cnt_lsb >= range / 2)
            m_picOrderMsb += range;
        else if (slice->pic_order_cnt_lsb > m_prevPicOrder && slice->pic_order_cnt_lsb - m_prevPicOrder >= range / 2)
            m_picOrderMsb -= range;

        m_prevPicOrder = slice->pic_order_cnt_lsb;
    }

    return slice->pic_order_cnt_lsb + m_picOrderMsb + m_picOrderBase;
}